

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  ImFontAtlasCustomRect *in_RDI;
  ImFontAtlasCustomRect r;
  ImFontAtlasCustomRect *in_stack_ffffffffffffffb8;
  
  ImFontAtlasCustomRect::ImFontAtlasCustomRect(in_RDI);
  ImVector<ImFontAtlasCustomRect>::push_back
            ((ImVector<ImFontAtlasCustomRect> *)in_RDI,in_stack_ffffffffffffffb8);
  return (int)in_RDI[2].GlyphOffset.x + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    // Breaking change on 2019/11/21 (1.74): ImFontAtlas::AddCustomRectRegular() now requires an ID >= 0x110000 (instead of >= 0x10000)
    IM_ASSERT(id >= 0x110000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}